

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O3

SPIRConstantOp * __thiscall
spirv_cross::Parser::
set<spirv_cross::SPIRConstantOp,unsigned_int&,spv::Op&,unsigned_int_const*,unsigned_int>
          (Parser *this,uint32_t id,uint *args,Op *args_1,uint **args_2,uint *args_3)

{
  Variant *this_00;
  SPIRConstantOp *val;
  
  ParsedIR::add_typed_id(&this->ir,TypeConstantOp,(ID)id);
  this_00 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id;
  val = ObjectPool<spirv_cross::SPIRConstantOp>::
        allocate<unsigned_int&,spv::Op&,unsigned_int_const*,unsigned_int>
                  ((ObjectPool<spirv_cross::SPIRConstantOp> *)
                   this_00->group->pools[9]._M_t.
                   super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                   .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl,args,
                   args_1,args_2,args_3);
  Variant::set(this_00,&val->super_IVariant,TypeConstantOp);
  (val->super_IVariant).self.id = id;
  return val;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}